

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O0

void __thiscall
protozero::basic_pbf_writer<protozero::fixed_size_buffer_adaptor>::add_bytes
          (basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *this,pbf_tag_type tag,char *value
          ,size_t size)

{
  uint uVar1;
  assert_error *paVar2;
  size_t size_local;
  char *value_local;
  pbf_tag_type tag_local;
  basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *this_local;
  
  if (this->m_pos != 0) {
    paVar2 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error
              (paVar2,
               "m_pos == 0 && \"you can\'t add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage\""
              );
    __cxa_throw(paVar2,&assert_error::typeinfo,assert_error::~assert_error);
  }
  if (this->m_data == (fixed_size_buffer_adaptor *)0x0) {
    paVar2 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar2,"m_data");
    __cxa_throw(paVar2,&assert_error::typeinfo,assert_error::~assert_error);
  }
  uVar1 = Catch::clara::std::numeric_limits<unsigned_int>::max();
  if (uVar1 < size) {
    paVar2 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar2,"size <= std::numeric_limits<pbf_length_type>::max()");
    __cxa_throw(paVar2,&assert_error::typeinfo,assert_error::~assert_error);
  }
  add_length_varint(this,tag,(pbf_length_type)size);
  buffer_customization<protozero::fixed_size_buffer_adaptor>::append(this->m_data,value,size);
  return;
}

Assistant:

void add_bytes(pbf_tag_type tag, const char* value, std::size_t size) {
        protozero_assert(m_pos == 0 && "you can't add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage");
        protozero_assert(m_data);
        protozero_assert(size <= std::numeric_limits<pbf_length_type>::max());
        add_length_varint(tag, static_cast<pbf_length_type>(size));
        buffer_customization<TBuffer>::append(m_data, value, size);
    }